

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  char *__to_00;
  long lVar5;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if ((char *)*this->rootNode != (char *)0xffffffffffffffff) {
    lVar1 = this[2].rootNode[1];
    lVar4 = (long)__from * 0x90;
    dVar8 = *(double *)(lVar1 + 0x48 + lVar4) * 0.5 + *(double *)(lVar1 + 0x50 + lVar4) * 0.5;
    pcVar2 = (char *)*this->rootNode;
    do {
      __to_00 = pcVar2;
      lVar5 = (long)__to_00 * 0x90;
      dVar9 = *(double *)(lVar1 + 0x48 + lVar5) * 0.5 + *(double *)(lVar1 + 0x50 + lVar5) * 0.5;
      uVar6 = 1;
      if (dVar8 <= dVar9) {
        if (dVar9 <= dVar8) {
          iVar3 = (int)((ulong)(*(long *)(lVar1 + 8 + lVar4) - *(long *)(lVar1 + lVar4)) >> 4);
          iVar7 = (int)((ulong)(*(long *)(lVar1 + 8 + lVar5) - *(long *)(lVar1 + lVar5)) >> 4);
          if (iVar7 <= iVar3) {
            uVar6 = (ulong)((long)__to_00 < (long)__from && iVar3 <= iVar7);
          }
        }
        else {
          uVar6 = 0;
        }
      }
      pcVar2 = *(char **)(lVar5 + lVar1 + 0x78 + uVar6 * 8);
    } while (pcVar2 != (char *)0xffffffffffffffff);
    iVar3 = CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                      ((CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)this,__from,__to_00)
    ;
    return iVar3;
  }
  iVar3 = CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)this,__from,
                     (char *)0xffffffffffffffff);
  return iVar3;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }